

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

ValueInfo * __thiscall
GlobOpt::NewIntRangeValueInfo(GlobOpt *this,ValueInfo *originalValueInfo,int32 min,int32 max)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Sym *sym;
  bool local_31;
  IntRangeValueInfo *local_28;
  ValueInfo *valueInfo;
  int32 max_local;
  int32 min_local;
  ValueInfo *originalValueInfo_local;
  GlobOpt *this_local;
  
  if (originalValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x110a,"(originalValueInfo)","originalValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (min == max) {
    local_28 = (IntRangeValueInfo *)IntConstantValueInfo::New(this->alloc,min);
  }
  else {
    allocator = this->alloc;
    local_31 = false;
    if ((min < 1) && (local_31 = false, -1 < max)) {
      local_31 = ValueInfo::WasNegativeZeroPreventedByBailout(originalValueInfo);
    }
    local_28 = IntRangeValueInfo::New(allocator,min,max,local_31);
  }
  sym = ValueInfo::GetSymStore(originalValueInfo);
  ValueInfo::SetSymStore(&local_28->super_ValueInfo,sym);
  return &local_28->super_ValueInfo;
}

Assistant:

ValueInfo *GlobOpt::NewIntRangeValueInfo(
    const ValueInfo *const originalValueInfo,
    const int32 min,
    const int32 max) const
{
    Assert(originalValueInfo);

    ValueInfo *valueInfo;
    if(min == max)
    {
        // Since int constant values are const-propped, negative zero tracking does not track them, and so it's okay to ignore
        // 'wasNegativeZeroPreventedByBailout'
        valueInfo = IntConstantValueInfo::New(alloc, min);
    }
    else
    {
        valueInfo =
            IntRangeValueInfo::New(
                alloc,
                min,
                max,
                min <= 0 && max >= 0 && originalValueInfo->WasNegativeZeroPreventedByBailout());
    }
    valueInfo->SetSymStore(originalValueInfo->GetSymStore());
    return valueInfo;
}